

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Gia_Man_t * Acb_NtkDeriveMiterCnfInter2(Gia_Man_t *p,int iTar,int nTars)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  
  pGVar1 = Gia_ManDup(p);
  if (0 < iTar) {
    iVar4 = -nTars;
    iVar5 = iTar;
    do {
      pGVar2 = Gia_ManDupUniv(pGVar1,pGVar1->vCis->nSize + iVar4);
      if (pGVar2->vCis->nSize != pGVar1->vCis->nSize) {
        __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                      ,0x984,"Gia_Man_t *Acb_NtkDeriveMiterCnfInter2(Gia_Man_t *, int, int)");
      }
      Gia_ManStop(pGVar1);
      pGVar1 = Acb_NtkEcoSynthesize(pGVar2);
      Gia_ManStop(pGVar2);
      iVar4 = iVar4 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  pGVar2 = Gia_ManDupCofactorVar(pGVar1,pGVar1->vCis->nSize + (iTar - nTars),1);
  pGVar3 = Gia_ManDupCofactorVar(pGVar1,(iTar - nTars) + pGVar1->vCis->nSize,0);
  Gia_ManStop(pGVar1);
  pGVar1 = Acb_NtkEcoSynthesize(pGVar2);
  Gia_ManStop(pGVar2);
  pGVar2 = Acb_NtkEcoSynthesize(pGVar3);
  Gia_ManStop(pGVar3);
  printf("Cof0 : ");
  Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
  printf("Cof1 : ");
  Gia_ManPrintStats(pGVar2,(Gps_Par_t *)0x0);
  if ((pGVar2->nObjs == pGVar2->vCis->nSize + pGVar2->vCos->nSize + 1) ||
     (pGVar1->nObjs == pGVar1->vCis->nSize + pGVar1->vCos->nSize + 1)) {
    pGVar3 = Gia_ManDup(pGVar2);
  }
  else {
    pGVar3 = Gia_ManInterOneInt(pGVar2,pGVar1,7);
  }
  Gia_ManStop(pGVar1);
  Gia_ManStop(pGVar2);
  pGVar1 = Abc_GiaSynthesizeInter(pGVar3);
  Gia_ManStop(pGVar3);
  pGVar2 = Gia_ManDupRemovePis(pGVar1,nTars);
  Gia_ManStop(pGVar1);
  return pGVar2;
}

Assistant:

Gia_Man_t * Acb_NtkDeriveMiterCnfInter2( Gia_Man_t * p, int iTar, int nTars )
{
//    extern Gia_Man_t * Gia_ManInterOne( Gia_Man_t * pNtkOn, Gia_Man_t * pNtkOff, int fVerbose );
    extern Gia_Man_t * Abc_GiaSynthesizeInter( Gia_Man_t * p );
    Gia_Man_t * pInter, * pCof0, * pCof1, * pCof = Gia_ManDup( p ); int v;
    for ( v = 0; v < iTar; v++ )
    {
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );

        pCof = Acb_NtkEcoSynthesize( p = pCof );
        Gia_ManStop( p );
    }
    pCof0 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 1 );
    pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
    Gia_ManStop( pCof );
    pCof0 = Acb_NtkEcoSynthesize( p = pCof0 );
    Gia_ManStop( p );
    pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
    Gia_ManStop( p );

    printf( "Cof0 : " );
    Gia_ManPrintStats( pCof0, NULL );
    printf( "Cof1 : " );
    Gia_ManPrintStats( pCof1, NULL );

    if ( Gia_ManAndNum(pCof1) == 0 || Gia_ManAndNum(pCof0) == 0 )
        pInter = Gia_ManDup(pCof1);
    else
        pInter = Gia_ManInterOneInt( pCof1, pCof0, 7 );
    Gia_ManStop( pCof0 );
    Gia_ManStop( pCof1 );
    pInter = Abc_GiaSynthesizeInter( p = pInter );
    Gia_ManStop( p );
    //Gia_ManPrintStats( pInter, NULL );
    pInter = Gia_ManDupRemovePis( p = pInter, nTars );
    Gia_ManStop( p );
    //Gia_ManPrintStats( pInter, NULL );
    return pInter;
}